

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_Errors_DD_Errors_Test::TestBody
          (TokenizerTest_Errors_DD_Errors_Test *this)

{
  Message *pMVar1;
  Message local_28;
  ScopedTrace local_19;
  uint local_18;
  uint uStack_14;
  ScopedTrace gtest_trace_1184;
  int j;
  int i;
  TokenizerTest_Errors_DD_Errors_Test *this_local;
  
  for (uStack_14 = 0; uStack_14 < 0x1c; uStack_14 = uStack_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      testing::Message::Message(&local_28);
      pMVar1 = testing::Message::operator<<(&local_28,(char (*) [19])"kErrorCases case #");
      pMVar1 = testing::Message::operator<<(pMVar1,(int *)&stack0xffffffffffffffec);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x20d8522);
      pMVar1 = testing::Message::operator<<
                         (pMVar1,(ErrorCase *)
                                 (io::(anonymous_namespace)::kErrorCases +
                                 (long)(int)uStack_14 * 0x30));
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x1fe663c);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [19])"kBlockSizes case #");
      pMVar1 = testing::Message::operator<<(pMVar1,(int *)&local_18);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x20d8522);
      pMVar1 = testing::Message::operator<<
                         (pMVar1,(int *)(io::(anonymous_namespace)::kBlockSizes +
                                        (long)(int)local_18 * 4));
      testing::ScopedTrace::ScopedTrace<testing::Message>
                (&local_19,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x4a0,pMVar1);
      testing::Message::~Message(&local_28);
      io::(anonymous_namespace)::TokenizerTest_Errors_DD::
      DoSingleCase<google::protobuf::io::(anonymous_namespace)::ErrorCase,int>
                ((TokenizerTest_Errors_DD *)this,
                 (ErrorCase *)(io::(anonymous_namespace)::kErrorCases + (long)(int)uStack_14 * 0x30)
                 ,(int *)(io::(anonymous_namespace)::kBlockSizes + (long)(int)local_18 * 4));
      testing::ScopedTrace::~ScopedTrace(&local_19);
    }
  }
  return;
}

Assistant:

TEST_2D(TokenizerTest, Errors, kErrorCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kErrorCases_case.input.data(),
                        kErrorCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Ignore all input, except remember if the last token was "foo".
  bool last_was_foo = false;
  while (tokenizer.Next()) {
    last_was_foo = tokenizer.current().text == "foo";
  }

  // Check that the errors match what was expected.
  EXPECT_EQ(kErrorCases_case.errors, error_collector.text_);

  // If the error was recoverable, make sure we saw "foo" after it.
  if (kErrorCases_case.recoverable) {
    EXPECT_TRUE(last_was_foo);
  }
}